

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O2

uint32_t __thiscall PatchCredits::inject_func_choose_ending_palette(PatchCredits *this,ROM *rom)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  initializer_list<md::DataRegister> __l_03;
  initializer_list<md::AddressRegister> __l_04;
  allocator_type local_11a;
  allocator_type local_119;
  AddressInRegister ret;
  AddressRegister local_f8;
  undefined **local_e8;
  undefined1 local_e0;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_d8;
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_c0;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ret._reg.super_Register.super_Param._vptr_Param._0_1_ = 1;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea(&func,0xff0080,(AddressRegister *)&ret);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)0x200ff001c;
  md::Code::cmpib(&func,'\x02',&ret.super_Param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"not_arg",(allocator<char> *)&local_f8);
  md::Code::bne(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::lea(&func,this->_red_credits_palette_addr,(AddressRegister *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"ret",(allocator<char> *)&local_f8);
  md::Code::bra(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"not_arg",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  ret._offset = CONCAT11(ret._offset._1_1_,1);
  ret._reg.super_Register._8_8_ = &PTR_getXn_00246bf0;
  __l._M_len = 2;
  __l._M_array = (iterator)&ret;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,__l,&local_119
            );
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_e0 = 1;
  local_e8 = &PTR_getXn_00246c60;
  __l_00._M_len = 2;
  __l_00._M_array = &local_f8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8,__l_00,
             &local_11a);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_c0);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::lea(&func,0xff1060,(AddressRegister *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param._0_1_ = 1;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::lea(&func,this->_all_checks_bytes_addr,(AddressRegister *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"checks_loop",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246d28;
  ret._reg.super_Register._8_8_ = ret._reg.super_Register._8_8_ & 0xffffffffffffff00;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  ret._offset = 0;
  ret._m_without_offset = '\x03';
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::movew(&func,&ret.super_Param,(Param *)&local_f8);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246d28;
  ret._reg.super_Register._code = '\x01';
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  ret._offset = 0;
  ret._m_without_offset = '\x03';
  local_f8.super_Register._code = '\x01';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::movew(&func,&ret.super_Param,(Param *)&local_f8);
  ret._reg.super_Register.super_Param._vptr_Param._0_1_ = 1;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::andw(&func,&ret.super_Param,(DataRegister *)&local_f8);
  ret._reg.super_Register.super_Param._vptr_Param._0_1_ = 1;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::cmpw(&func,&ret.super_Param,(DataRegister *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"not_all_checks",(allocator<char> *)&local_f8);
  md::Code::bne(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::cmpa(&func,0xff109c,(AddressRegister *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"checks_loop",(allocator<char> *)&local_f8);
  md::Code::blt(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  ret._offset = CONCAT11(ret._offset._1_1_,1);
  ret._reg.super_Register._8_8_ = &PTR_getXn_00246bf0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&ret;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,__l_01,
             &local_119);
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_e0 = 1;
  local_e8 = &PTR_getXn_00246c60;
  __l_02._M_len = 2;
  __l_02._M_array = &local_f8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8,__l_02,
             &local_11a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_c0);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::lea(&func,this->_gold_credits_palette_addr,(AddressRegister *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"ret",(allocator<char> *)&local_f8);
  md::Code::bra(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"not_all_checks",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  ret._offset = CONCAT11(ret._offset._1_1_,1);
  ret._reg.super_Register._8_8_ = &PTR_getXn_00246bf0;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&ret;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,__l_03,
             &local_119);
  local_f8.super_Register._code = '\0';
  local_f8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_e0 = 1;
  local_e8 = &PTR_getXn_00246c60;
  __l_04._M_len = 2;
  __l_04._M_array = &local_f8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8,__l_04,
             &local_11a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_c0,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_c0);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)0x200ff107d;
  md::Code::btst(&func,'\0',&ret.super_Param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"ret",(allocator<char> *)&local_f8);
  md::Code::beq(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  md::Code::lea(&func,this->_blue_credits_palette_addr,(AddressRegister *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"ret",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,"",(allocator<char> *)&local_f8)
  ;
  uVar1 = md::ROM::inject_code(rom,&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  md::Code::~Code(&func);
  return uVar1;
}

Assistant:

uint32_t inject_func_choose_ending_palette(md::ROM& rom)
    {
        md::Code func;
        {
            func.lea(0xFF0080, reg_A1); // instruction erased by the jsr
            func.cmpib(2, addr_(0xFF001C));
            func.bne("not_arg");
            {
                func.lea(_red_credits_palette_addr, reg_A0); // Use red credits palette if Dark Gola has been beaten
                func.bra("ret");
            }
            func.label("not_arg");
            func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.lea(0xFF1060, reg_A0);
            func.lea(_all_checks_bytes_addr, reg_A1);
            func.label("checks_loop");
            {
                func.movew(addr_postinc_(reg_A0), reg_D0);  // A0/D0 = cursor on check flags
                func.movew(addr_postinc_(reg_A1), reg_D1);  // A1/D1 = cursor on target values
                func.andw(reg_D1, reg_D0);                  // Check if D0 contains at least all bits set in D1
                func.cmpw(reg_D1, reg_D0);
                func.bne("not_all_checks");                 // If at least one is not equal, don't give golden ending
                func.cmpa(0xFF109C, reg_A0);
                func.blt("checks_loop");
                func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
                func.lea(_gold_credits_palette_addr, reg_A0); // Everything was collected, give the golden credits
                func.bra("ret");
            }

            func.label("not_all_checks");
            func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.btst(FLAG_USED_BLUE_RIBBON.bit, addr_(0xFF1000 + FLAG_USED_BLUE_RIBBON.byte));
            func.beq("ret");
            {
                func.lea(_blue_credits_palette_addr, reg_A0); // Use blue credits palette if blue ribbon is held
            }
            func.label("ret");
        }
        func.rts();
        return rom.inject_code(func);
    }